

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void CheckRangeCallback(void *ptr,Type type,size_t min_size)

{
  long *plVar1;
  char *in_R9;
  size_t *local_98;
  anon_class_32_4_7539d260 callback;
  size_t min_size_local;
  uintptr_t addr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  Type local_44;
  internal local_40 [4];
  Type type_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  AssertHelper local_28;
  internal local_19 [8];
  bool matched;
  
  callback.addr = (uintptr_t *)&local_44;
  callback.type = (Type *)&callback.matched;
  callback.matched = (bool *)&testing::internal::StreamableToString<int>;
  callback.min_size = (size_t *)local_19;
  local_19[0] = (internal)0x0;
  local_98 = &min_size_local;
  min_size_local = (size_t)ptr;
  local_44 = type;
  plVar1 = (long *)MallocExtension::instance();
  (**(code **)(*plVar1 + 0x50))
            (plVar1,&local_98,
             tcmalloc::FunctionRefFirstDataArg<void(base::MallocRange_const*)>::
             FunctionRefFirstDataArg<CheckRangeCallback(void*,base::MallocRange::Type,unsigned_long)::$_0>(CheckRangeCallback(void*,base::MallocRange::Type,unsigned_long)::$_0_const&)
             ::{lambda(void*,base::MallocRange_const*)#1}::MallocRange_const__);
  local_40[0] = local_19[0];
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_19[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&addr,local_40,(AssertionResult *)"matched","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x3b5,(char *)addr);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)addr != &local_58) {
      operator_delete((void *)addr,local_58._M_allocated_capacity + 1);
    }
    if (local_30._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  return;
}

Assistant:

static void CheckRangeCallback(void* ptr, base::MallocRange::Type type,
                               size_t min_size) {
  bool matched = false;
  const uintptr_t addr = reinterpret_cast<uintptr_t>(ptr);
  auto callback = [&] (const base::MallocRange* r) -> void {
    if (!(r->address <= addr && addr < r->address + r->length)) {
      return;
    }

    if (type == base::MallocRange::FREE) {
      // We are expecting r->type == FREE, but ReleaseMemory
      // may have already moved us to UNMAPPED state instead (this happens in
      // approximately 0.1% of executions). Accept either state.
      CHECK(r->type == base::MallocRange::FREE ||
            r->type == base::MallocRange::UNMAPPED);
    } else {
      CHECK_EQ(r->type, type);
    }
    CHECK_GE(r->length, min_size);

    matched = true;
  };

  tcmalloc::FunctionRefFirstDataArg<void(const base::MallocRange*)> ref(callback);
  MallocExtension::instance()->Ranges(ref.data, ref.fn);
  EXPECT_TRUE(matched);
}